

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int expand(archive_read *a,int64_t *end)

{
  long *plVar1;
  byte bVar2;
  void *pvVar3;
  undefined8 uVar4;
  rar_program_code *prVar5;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint32_t uVar14;
  uint uVar15;
  uint8_t *puVar16;
  byte *buf;
  rar_program_code *prog;
  uLong uVar17;
  undefined8 *__ptr;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long *plVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  huffman_code *code;
  uint8_t uVar26;
  size_t __size;
  void *pvVar27;
  ulong uVar28;
  void *pvVar29;
  uint64_t uVar30;
  ulong uVar31;
  uint uVar32;
  long lVar33;
  uint8_t flags;
  byte local_129;
  archive_read *local_128;
  byte local_11d;
  uint32_t local_11c;
  long *local_118;
  memory_bit_reader local_110;
  rar_br *local_e8;
  int *local_e0;
  huffman_code *local_d8;
  void *local_d0;
  uint8_t *local_c8;
  uint local_bc;
  undefined8 local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  uint32_t uStack_a8;
  uint32_t uStack_a4;
  undefined8 uStack_a0;
  ulong local_90;
  long local_88;
  undefined8 *local_80;
  memory_bit_reader local_78;
  void *local_50;
  huffman_code *local_48;
  huffman_code *local_40;
  huffman_code *local_38;
  
  pvVar3 = a->format->data;
  lVar33 = *(long *)((long)pvVar3 + 0x3a8);
  lVar19 = *end;
  if (lVar33 < *end) {
    *end = lVar33;
    lVar19 = lVar33;
  }
  lVar33 = *(long *)((long)pvVar3 + 0x360);
  if (lVar33 < lVar19) {
    if (*(char *)((long)pvVar3 + 0x3d2) == '\0') {
      local_e8 = (rar_br *)((long)pvVar3 + 0x4f30);
      code = (huffman_code *)((long)pvVar3 + 0x118);
      local_40 = (huffman_code *)((long)pvVar3 + 0x140);
      local_48 = (huffman_code *)((long)pvVar3 + 0x168);
      local_e0 = (int *)((long)pvVar3 + 0x370);
      local_38 = (huffman_code *)((long)pvVar3 + 400);
      local_80 = (undefined8 *)((long)pvVar3 + 0x374);
      local_128 = a;
      local_118 = end;
      local_d8 = code;
      do {
        uVar8 = read_next_symbol(local_128,code);
        if ((int)uVar8 < 0) {
          return -0x1e;
        }
        if (uVar8 < 0x100) {
          *(char *)(*(long *)((long)pvVar3 + 0x350) +
                   (long)(int)(*(uint *)((long)pvVar3 + 0x358) & *(uint *)((long)pvVar3 + 0x360))) =
               (char)uVar8;
          *(long *)((long)pvVar3 + 0x360) = *(long *)((long)pvVar3 + 0x360) + 1;
        }
        else if (uVar8 == 0x102) {
          uVar23 = *(uint *)((long)pvVar3 + 0x368);
          if (uVar23 != 0) {
            iVar10 = *(int *)((long)pvVar3 + 0x36c);
            goto LAB_006fe1be;
          }
        }
        else {
          if (uVar8 == 0x101) {
            pvVar27 = local_128->format->data;
            iVar10 = rar_decode_byte(local_128,&local_11d);
            bVar7 = local_11d;
            if (iVar10 == 0) {
              return -0x1e;
            }
            uVar8 = (uint)local_11d;
            uVar23 = (uint)local_11d;
            uVar11 = (uVar8 & 7) + 1;
            if ((char)uVar11 == '\a') {
              iVar10 = rar_decode_byte(local_128,&local_129);
              if (iVar10 == 0) {
                return -0x1e;
              }
              uVar11 = local_129 + 7;
            }
            else if ((char)uVar11 == '\b') {
              iVar10 = rar_decode_byte(local_128,&local_129);
              bVar2 = local_129;
              if (iVar10 == 0) {
                return -0x1e;
              }
              iVar10 = rar_decode_byte(local_128,&local_129);
              if (iVar10 == 0) {
                return -0x1e;
              }
              uVar11 = (uint)CONCAT11(bVar2,local_129);
            }
            uVar21 = (ulong)uVar11;
            puVar16 = (uint8_t *)malloc(uVar21);
            local_c8 = puVar16;
            uVar20 = uVar21;
            if (puVar16 == (uint8_t *)0x0) {
              return -0x1e;
            }
            for (; uVar20 != 0; uVar20 = uVar20 - 1) {
              iVar10 = rar_decode_byte(local_128,puVar16);
              if (iVar10 == 0) goto LAB_006fe49d;
              puVar16 = puVar16 + 1;
            }
            pvVar29 = local_128->format->data;
            local_110.offset = 0;
            local_110.bits = 0;
            local_110.available = 0;
            local_110.at_eof = 0;
            uStack_a8 = 0;
            uStack_a4 = 0;
            uStack_a0 = 0;
            local_b8 = 0;
            uStack_b0 = 0;
            uStack_ac = 0;
            uVar11 = 0;
            prog = *(rar_program_code **)((long)pvVar29 + 0x398);
            for (prVar5 = prog; prVar5 != (rar_program_code *)0x0; prVar5 = prVar5->next) {
              uVar11 = uVar11 + 1;
            }
            local_110.bytes = local_c8;
            local_110.length = uVar21;
            local_d0 = pvVar29;
            local_50 = pvVar27;
            if ((char)bVar7 < '\0') {
              uVar14 = membr_next_rarvm_number(&local_110);
              if (uVar14 == 0) {
                delete_filter(*(rar_filter **)((long)pvVar29 + 0x3a0));
                prog = (rar_program_code *)0x0;
                *(undefined8 *)((long)pvVar29 + 0x3a0) = 0;
                delete_program_code(*(rar_program_code **)((long)pvVar29 + 0x398));
                *(undefined8 *)((long)pvVar29 + 0x398) = 0;
                uVar15 = 0;
              }
              else {
                uVar15 = uVar14 - 1;
                if (uVar11 < uVar15) goto LAB_006fe49d;
              }
              *(uint *)((long)local_d0 + 0x3b0) = uVar15;
            }
            else {
              uVar15 = *(uint *)((long)pvVar29 + 0x3b0);
            }
            pvVar27 = local_d0;
            if (uVar11 < uVar15) {
              __assert_fail("num <= numprogs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibarchive/libarchive/archive_read_support_format_rar.c"
                            ,0xc8b,
                            "int parse_filter(struct archive_read *, const uint8_t *, uint16_t, uint8_t)"
                           );
            }
            for (; uVar15 != 0; uVar15 = uVar15 - 1) {
              prog = prog->next;
            }
            if (prog != (rar_program_code *)0x0) {
              prog->usagecount = prog->usagecount + 1;
            }
            uVar14 = membr_next_rarvm_number(&local_110);
            local_88 = *(long *)((long)pvVar27 + 0x360) + 0x102;
            if ((bVar7 & 0x40) == 0) {
              local_88 = *(long *)((long)pvVar27 + 0x360);
            }
            local_88 = local_88 + (ulong)uVar14;
            if ((bVar7 & 0x20) == 0) {
              if (prog != (rar_program_code *)0x0) {
                uStack_a8 = prog->oldfilterlength;
                goto LAB_006fdc5c;
              }
              uStack_a8 = 0;
LAB_006fdc76:
              uStack_a4 = 0;
            }
            else {
              uStack_a8 = membr_next_rarvm_number(&local_110);
              if (prog == (rar_program_code *)0x0) goto LAB_006fdc76;
LAB_006fdc5c:
              uStack_a4 = prog->usagecount;
            }
            uStack_ac = 0x3c000;
            uStack_a0 = CONCAT44(0x40000,(undefined4)uStack_a0);
            local_11c = uStack_a8;
            if ((bVar7 & 0x10) != 0) {
              if (local_110.available < 7) {
                uVar11 = 0;
                if (local_110.at_eof == 0) {
                  iVar10 = local_110.available;
                  uVar20 = local_110.offset;
                  if (local_110.offset < local_110.length) {
                    do {
                      uVar21 = uVar20 + 1;
                      local_110.bits = (ulong)local_110.bytes[uVar20] | local_110.bits << 8;
                      local_110.available = iVar10 + 8;
                      local_110.offset = uVar21;
                      if (-2 < iVar10) goto LAB_006fdd1c;
                      local_110.offset = local_110.length;
                      iVar10 = local_110.available;
                      uVar20 = uVar21;
                    } while (uVar21 != local_110.length);
                  }
                  local_110.at_eof = 1;
                }
              }
              else {
LAB_006fdd1c:
                local_110.available = local_110.available + -7;
                uVar11 = (uint)(local_110.bits >> ((byte)local_110.available & 0x3f)) & 0x7f;
              }
              lVar33 = 0;
              do {
                if ((uVar11 >> ((uint)lVar33 & 0x1f) & 1) != 0) {
                  uVar14 = membr_next_rarvm_number(&local_110);
                  *(uint32_t *)((long)&local_b8 + lVar33 * 4) = uVar14;
                }
                lVar33 = lVar33 + 1;
              } while (lVar33 != 7);
            }
            if (prog == (rar_program_code *)0x0) {
              uVar14 = membr_next_rarvm_number(&local_110);
              if (uVar14 - 0x10001 < 0xffff0000) goto LAB_006fe49d;
              uVar20 = (ulong)uVar14;
              buf = (byte *)malloc(uVar20);
              if (buf == (byte *)0x0) goto LAB_006fe49d;
              plVar1 = (long *)((long)local_d0 + 0x398);
              uVar21 = 0;
              do {
                if (local_110.available < 8) {
                  if (local_110.at_eof == 0) {
                    uVar31 = local_110.offset;
                    uVar28 = local_110.offset;
                    if (local_110.offset < local_110.length) {
                      do {
                        local_110.offset = uVar28 + 1;
                        local_110.bits = (ulong)local_110.bytes[uVar28] | local_110.bits << 8;
                        if (-1 < local_110.available) goto LAB_006fddd2;
                        local_110.available = local_110.available + 8;
                        uVar31 = local_110.length;
                        uVar28 = local_110.offset;
                      } while (local_110.offset != local_110.length);
                    }
                    bVar7 = 0;
                    local_110.at_eof = 1;
                    local_110.offset = uVar31;
                  }
                  else {
                    bVar7 = 0;
                  }
                }
                else {
                  local_110.available = local_110.available + -8;
LAB_006fddd2:
                  bVar7 = (byte)(local_110.bits >> ((byte)local_110.available & 0x3f));
                }
                buf[uVar21] = bVar7;
                uVar21 = uVar21 + 1;
              } while (uVar21 != uVar20);
              local_78.available = 7;
              local_78.at_eof = 0;
              if (uVar14 < 2) {
                bVar7 = 0;
              }
              else {
                uVar21 = 1;
                bVar7 = 0;
                do {
                  bVar7 = bVar7 ^ buf[uVar21];
                  uVar21 = uVar21 + 1;
                } while (uVar20 != uVar21);
              }
              local_bc = uVar23;
              if ((bVar7 == *buf) &&
                 (local_78.bytes = buf, local_78.length = uVar20,
                 prog = (rar_program_code *)calloc(1,0x38), prog != (rar_program_code *)0x0)) {
                uVar17 = cm_zlib_crc32(0,buf,uVar14);
                uVar8 = local_bc;
                prog->fingerprint = uVar20 << 0x20 | uVar17;
                if (uVar14 != 1) {
                  local_78.bits = (uint64_t)buf[1];
                  local_78.offset = 2;
                  if ((char)buf[1] < '\0') {
                    uVar14 = membr_next_rarvm_number(&local_78);
                    uVar20 = (ulong)(uVar14 + 1);
                    prog->staticdatalen = uVar14 + 1;
                    puVar16 = (uint8_t *)malloc(uVar20);
                    prog->staticdata = puVar16;
                    if (puVar16 == (uint8_t *)0x0) {
                      delete_program_code(prog);
                      goto LAB_006fe495;
                    }
                    if (uVar20 != 0) {
                      local_90 = local_78.length;
                      uVar31 = 0;
                      uVar21 = local_78.offset;
                      uVar30 = local_78.bits;
                      iVar10 = local_78.available;
                      iVar9 = local_78.at_eof;
                      do {
                        if (iVar10 < 8) {
                          if (iVar9 == 0) {
                            uVar28 = uVar21;
                            if (uVar21 < local_78.length) {
                              do {
                                uVar21 = uVar28 + 1;
                                uVar30 = (ulong)local_78.bytes[uVar28] | uVar30 << 8;
                                if (-1 < iVar10) goto LAB_006fe325;
                                iVar10 = iVar10 + 8;
                                uVar28 = uVar21;
                              } while (uVar21 != local_78.length);
                              uVar26 = '\0';
                              iVar9 = 1;
                              uVar21 = local_78.length;
                            }
                            else {
                              uVar26 = '\0';
                              iVar9 = 1;
                            }
                          }
                          else {
                            uVar26 = '\0';
                          }
                        }
                        else {
                          iVar10 = iVar10 + -8;
LAB_006fe325:
                          uVar26 = (uint8_t)(uVar30 >> ((byte)iVar10 & 0x3f));
                        }
                        puVar16[uVar31] = uVar26;
                        uVar31 = uVar31 + 1;
                      } while (uVar31 != uVar20);
                    }
                  }
                }
                free(buf);
                do {
                  plVar22 = plVar1;
                  lVar33 = *plVar22;
                  plVar1 = (long *)(lVar33 + 0x30);
                } while (lVar33 != 0);
                *plVar22 = (long)prog;
                goto LAB_006fdf00;
              }
            }
            else {
LAB_006fdf00:
              prog->oldfilterlength = local_11c;
              if ((uVar8 & 8) == 0) {
                uVar14 = 0;
                buf = (byte *)0x0;
                iVar10 = local_110.at_eof;
              }
              else {
                uVar14 = membr_next_rarvm_number(&local_110);
                if ((0x1fc0 < uVar14) ||
                   (buf = (byte *)malloc((ulong)(uVar14 + 0x40)), buf == (byte *)0x0))
                goto LAB_006fe49d;
                if (uVar14 == 0) {
                  uVar14 = 0;
                  iVar10 = local_110.at_eof;
                }
                else {
                  uVar21 = 0;
                  uVar30 = local_110.bits;
                  uVar20 = local_110.offset;
                  iVar10 = local_110.available;
                  do {
                    if (iVar10 < 8) {
                      if (local_110.at_eof == 0) {
                        uVar31 = uVar20;
                        uVar28 = uVar20;
                        if (uVar20 < local_110.length) {
                          do {
                            uVar20 = uVar28 + 1;
                            uVar30 = (ulong)local_110.bytes[uVar28] | uVar30 << 8;
                            if (-1 < iVar10) goto LAB_006fdf86;
                            iVar10 = iVar10 + 8;
                            uVar31 = local_110.length;
                            uVar28 = uVar20;
                          } while (uVar20 != local_110.length);
                        }
                        bVar7 = 0;
                        local_110.at_eof = 1;
                        uVar20 = uVar31;
                      }
                      else {
                        bVar7 = 0;
                      }
                    }
                    else {
                      iVar10 = iVar10 + -8;
LAB_006fdf86:
                      bVar7 = (byte)(uVar30 >> ((byte)iVar10 & 0x3f));
                    }
                    buf[uVar21 + 0x40] = bVar7;
                    uVar21 = uVar21 + 1;
                  } while (uVar21 != uVar14);
                  iVar10 = local_110.at_eof;
                }
              }
              if ((iVar10 == 0) &&
                 (__ptr = (undefined8 *)calloc(1,0x58), __ptr != (undefined8 *)0x0)) {
                *__ptr = prog;
                __size = 0x40;
                if (0x40 < uVar14) {
                  __size = (size_t)uVar14;
                }
                *(int *)(__ptr + 6) = (int)__size;
                pvVar27 = calloc(1,__size);
                __ptr[5] = pvVar27;
                if (pvVar27 != (void *)0x0) {
                  if (buf != (byte *)0x0) {
                    memcpy(pvVar27,buf,(ulong)uVar14);
                  }
                  __ptr[3] = CONCAT44(uStack_a4,uStack_a8);
                  __ptr[4] = uStack_a0;
                  __ptr[1] = local_b8;
                  __ptr[2] = CONCAT44(uStack_ac,uStack_b0);
                  __ptr[7] = local_88;
                  *(uint32_t *)(__ptr + 8) = local_11c;
                  free(buf);
                  code = local_d8;
                  end = local_118;
                  lVar33 = 0;
                  do {
                    *(undefined4 *)((long)pvVar27 + lVar33 * 4) =
                         *(undefined4 *)((long)&local_b8 + lVar33 * 4);
                    lVar33 = lVar33 + 1;
                  } while (lVar33 != 7);
                  *(char *)((long)pvVar27 + 0x1c) = (char)local_11c;
                  *(char *)((long)pvVar27 + 0x1d) = (char)(local_11c >> 8);
                  *(char *)((long)pvVar27 + 0x1e) = (char)(local_11c >> 0x10);
                  *(char *)((long)pvVar27 + 0x1f) = (char)(local_11c >> 0x18);
                  *(undefined4 *)((long)pvVar27 + 0x20) = 0;
                  *(uint32_t *)((long)pvVar27 + 0x2c) = prog->usagecount;
                  plVar1 = (long *)((long)local_d0 + 0x3a0);
                  do {
                    plVar22 = plVar1;
                    lVar33 = *plVar22;
                    plVar1 = (long *)(lVar33 + 0x50);
                  } while (lVar33 != 0);
                  *plVar22 = (long)__ptr;
                  if (*(long *)(*(long *)((long)local_d0 + 0x3a0) + 0x50) == 0) {
                    *(long *)((long)local_d0 + 0x3a8) = local_88;
                  }
                  free(local_c8);
                  if (*(long *)((long)local_50 + 0x3a8) < *end) {
                    *end = *(long *)((long)local_50 + 0x3a8);
                  }
                  goto LAB_006fe27e;
                }
                free(__ptr);
              }
            }
LAB_006fe495:
            free(buf);
LAB_006fe49d:
            free(local_c8);
            return -0x1e;
          }
          if (uVar8 == 0x100) {
            iVar10 = *(int *)((long)pvVar3 + 0x4f38);
            if (iVar10 < 1) {
              iVar9 = rar_br_fillup(local_128,local_e8);
              iVar10 = *(int *)((long)pvVar3 + 0x4f38);
              if (iVar10 < 1 && iVar9 == 0) goto LAB_006fe46b;
            }
            code = local_d8;
            uVar8 = iVar10 - 1;
            *(uint *)((long)pvVar3 + 0x4f38) = uVar8;
            if ((*(ulong *)((long)pvVar3 + 0x4f30) >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
              *(undefined1 *)((long)pvVar3 + 0xec) = 1;
              if (iVar10 < 2) {
                iVar10 = rar_br_fillup(local_128,local_e8);
                uVar8 = *(uint *)((long)pvVar3 + 0x4f38);
                if ((int)uVar8 < 1 && iVar10 == 0) goto LAB_006fe46b;
              }
              *(bool *)((long)pvVar3 + 0x388) =
                   (*(ulong *)((long)pvVar3 + 0x4f30) >> ((ulong)(uVar8 - 1) & 0x3f) & 1) != 0;
              *(uint *)((long)pvVar3 + 0x4f38) = uVar8 - 1;
              *local_118 = *(long *)((long)pvVar3 + 0x360);
              return 0;
            }
            iVar10 = parse_codes(local_128);
            end = local_118;
            if (iVar10 != 0) {
              return -0x1e;
            }
            goto LAB_006fe27e;
          }
          if (uVar8 < 0x107) {
            iVar10 = local_e0[uVar8 - 0x103];
            uVar11 = read_next_symbol(local_128,local_38);
            if (0x1c < uVar11) goto LAB_006fe3ea;
            uVar23 = ""[uVar11] + 2;
            if (7 < uVar11) {
              bVar7 = ""[uVar11];
              iVar9 = *(int *)((long)pvVar3 + 0x4f38);
              if (iVar9 < (int)(uint)bVar7) {
                iVar12 = rar_br_fillup(local_128,local_e8);
                iVar9 = *(int *)((long)pvVar3 + 0x4f38);
                if ((iVar12 == 0) && (iVar9 < (int)(uint)bVar7)) goto LAB_006fe46b;
              }
              iVar9 = iVar9 - (uint)bVar7;
              uVar23 = ((uint)(*(ulong *)((long)pvVar3 + 0x4f30) >> ((byte)iVar9 & 0x3f)) &
                       cache_masks[bVar7]) + uVar23;
              *(int *)((long)pvVar3 + 0x4f38) = iVar9;
              code = local_d8;
            }
            uVar20 = (ulong)(uVar8 - 0x103);
            if (0x103 < uVar8) {
              do {
                local_e0[uVar20] = local_e0[uVar20 - 1];
                bVar6 = 1 < uVar20;
                uVar20 = uVar20 - 1;
              } while (bVar6);
            }
            *local_e0 = iVar10;
            end = local_118;
LAB_006fe1be:
            *(int *)((long)pvVar3 + 0x36c) = iVar10;
            *(uint *)((long)pvVar3 + 0x368) = uVar23;
            lVar33 = *(long *)((long)pvVar3 + 0x360);
            if (0 < (int)uVar23) goto LAB_006fe1db;
          }
          else {
            if (0x10e < uVar8) {
              if (299 < uVar8) {
LAB_006fe3ea:
                archive_set_error(&local_128->archive,0x54,"Bad RAR file data");
                return -0x1e;
              }
              uVar8 = uVar8 - 0x10f;
              iVar9 = ""[uVar8] + 3;
              if (7 < uVar8) {
                bVar7 = ""[uVar8];
                iVar10 = *(int *)((long)pvVar3 + 0x4f38);
                if (iVar10 < (int)(uint)bVar7) {
                  iVar12 = rar_br_fillup(local_128,local_e8);
                  iVar10 = *(int *)((long)pvVar3 + 0x4f38);
                  if ((iVar12 == 0) && (iVar10 < (int)(uint)bVar7)) goto LAB_006fe46b;
                }
                iVar10 = iVar10 - (uint)bVar7;
                iVar9 = ((uint)(*(ulong *)((long)pvVar3 + 0x4f30) >> ((byte)iVar10 & 0x3f)) &
                        cache_masks[bVar7]) + iVar9;
                *(int *)((long)pvVar3 + 0x4f38) = iVar10;
                code = local_d8;
              }
              uVar8 = read_next_symbol(local_128,local_40);
              if (0x3c < uVar8) goto LAB_006fe3ea;
              uVar20 = (ulong)uVar8;
              iVar10 = expand::offsetbases[uVar20] + 1;
              end = local_118;
              if (3 < uVar8) {
                bVar7 = ""[uVar20];
                if (uVar8 < 10) {
                  iVar12 = *(int *)((long)pvVar3 + 0x4f38);
                  if (iVar12 < (int)(uint)bVar7) {
                    iVar24 = rar_br_fillup(local_128,local_e8);
                    iVar12 = *(int *)((long)pvVar3 + 0x4f38);
                    if ((iVar24 == 0) && (iVar12 < (int)(uint)bVar7)) {
LAB_006fe46b:
                      archive_set_error(&local_128->archive,0x54,"Truncated RAR file data");
                      *(undefined1 *)((long)pvVar3 + 0xd0) = 0;
                      return -0x1e;
                    }
                  }
                  iVar12 = iVar12 - (uint)bVar7;
                  iVar10 = ((uint)(*(ulong *)((long)pvVar3 + 0x4f30) >> ((byte)iVar12 & 0x3f)) &
                           cache_masks[bVar7]) + iVar10;
                  *(int *)((long)pvVar3 + 0x4f38) = iVar12;
                  code = local_d8;
                  end = local_118;
                }
                else {
                  if (uVar20 - 0xc < 0x30) {
                    iVar12 = *(int *)((long)pvVar3 + 0x4f38);
                    iVar24 = bVar7 - 4;
                    if (iVar12 < iVar24) {
                      iVar13 = rar_br_fillup(local_128,local_e8);
                      iVar12 = *(int *)((long)pvVar3 + 0x4f38);
                      if ((iVar13 == 0) && (iVar12 < iVar24)) goto LAB_006fe46b;
                    }
                    iVar10 = ((uint)(*(ulong *)((long)pvVar3 + 0x4f30) >>
                                    ((byte)(iVar12 - iVar24) & 0x3f)) &
                             *(uint *)("" + (ulong)bVar7 * 4 + 1)) * 0x10 + iVar10;
                    *(int *)((long)pvVar3 + 0x4f38) = iVar12 - iVar24;
                    code = local_d8;
                  }
                  end = local_118;
                  if (*(int *)((long)pvVar3 + 900) == 0) {
                    iVar12 = read_next_symbol(local_128,local_48);
                    if (iVar12 < 0) {
                      return -0x1e;
                    }
                    if (iVar12 == 0x10) {
                      *(undefined4 *)((long)pvVar3 + 900) = 0xf;
                      iVar10 = iVar10 + *(int *)((long)pvVar3 + 0x380);
                    }
                    else {
                      iVar10 = iVar10 + iVar12;
                      *(int *)((long)pvVar3 + 0x380) = iVar12;
                    }
                  }
                  else {
                    *(int *)((long)pvVar3 + 900) = *(int *)((long)pvVar3 + 900) + -1;
                    iVar10 = iVar10 + *(int *)((long)pvVar3 + 0x380);
                  }
                }
              }
              uVar4 = *(undefined8 *)local_e0;
              *(int *)(local_80 + 1) = local_e0[2];
              *local_80 = uVar4;
              uVar23 = iVar9 + (uint)(0x3ffff < iVar10) + (uint)(0x1fff < iVar10);
              *local_e0 = iVar10;
              goto LAB_006fe1be;
            }
            bVar7 = ""[uVar8 - 0x107];
            bVar2 = "\x02\x02\x03\x04\x05\x06\x06\x06"[uVar8 - 0x107];
            iVar9 = *(int *)((long)pvVar3 + 0x4f38);
            if (iVar9 < (int)(uint)bVar2) {
              iVar10 = rar_br_fillup(local_128,local_e8);
              iVar9 = *(int *)((long)pvVar3 + 0x4f38);
              if ((iVar10 == 0) && (iVar9 < (int)(uint)bVar2)) goto LAB_006fe46b;
            }
            iVar9 = iVar9 - (uint)bVar2;
            iVar10 = ((uint)(*(ulong *)((long)pvVar3 + 0x4f30) >> ((byte)iVar9 & 0x3f)) &
                     cache_masks[bVar2]) + bVar7 + 1;
            *(int *)((long)pvVar3 + 0x4f38) = iVar9;
            uVar4 = *(undefined8 *)local_e0;
            *(int *)(local_80 + 1) = local_e0[2];
            *local_80 = uVar4;
            *(int *)((long)pvVar3 + 0x370) = iVar10;
            *(int *)((long)pvVar3 + 0x36c) = iVar10;
            *(undefined4 *)((long)pvVar3 + 0x368) = 2;
            lVar33 = *(long *)((long)pvVar3 + 0x360);
            uVar23 = 2;
LAB_006fe1db:
            uVar8 = *(uint *)((long)pvVar3 + 0x358);
            uVar15 = (uint)lVar33 & uVar8;
            uVar32 = uVar15 - iVar10 & uVar8;
            uVar11 = uVar23;
            do {
              uVar18 = uVar32;
              if ((int)uVar32 < (int)uVar15) {
                uVar18 = uVar15;
              }
              uVar18 = (uVar8 - uVar18) + 1;
              if ((int)uVar11 < (int)uVar18) {
                uVar18 = uVar11;
              }
              pvVar29 = (void *)((long)(int)uVar15 + *(long *)((long)pvVar3 + 0x350));
              pvVar27 = (void *)(*(long *)((long)pvVar3 + 0x350) + (long)(int)uVar32);
              if (((int)(uVar18 + uVar15) < (int)uVar32) || ((int)(uVar18 + uVar32) < (int)uVar15))
              {
                memcpy(pvVar29,pvVar27,(long)(int)uVar18);
              }
              else if (0 < (int)uVar18) {
                uVar20 = 0;
                do {
                  *(undefined1 *)((long)pvVar29 + uVar20) = *(undefined1 *)((long)pvVar27 + uVar20);
                  uVar20 = uVar20 + 1;
                } while (uVar18 != uVar20);
              }
              uVar8 = *(uint *)((long)pvVar3 + 0x358);
              uVar15 = uVar18 + uVar15 & uVar8;
              uVar32 = uVar18 + uVar32 & uVar8;
              uVar25 = uVar11 - uVar18;
              bVar6 = (int)uVar18 <= (int)uVar11;
              uVar11 = uVar25;
            } while (uVar25 != 0 && bVar6);
            lVar33 = *(long *)((long)pvVar3 + 0x360);
            code = local_d8;
            end = local_118;
          }
          *(long *)((long)pvVar3 + 0x360) = (int)uVar23 + lVar33;
        }
LAB_006fe27e:
        lVar33 = *(long *)((long)pvVar3 + 0x360);
        if (*end <= lVar33) {
          return 0;
        }
      } while (*(char *)((long)pvVar3 + 0x3d2) == '\0');
    }
    *end = lVar33;
  }
  return 0;
}

Assistant:

static int
expand(struct archive_read *a, int64_t *end)
{
  static const unsigned char lengthbases[] =
    {   0,   1,   2,   3,   4,   5,   6,
        7,   8,  10,  12,  14,  16,  20,
       24,  28,  32,  40,  48,  56,  64,
       80,  96, 112, 128, 160, 192, 224 };
  static const unsigned char lengthbits[] =
    { 0, 0, 0, 0, 0, 0, 0,
      0, 1, 1, 1, 1, 2, 2,
      2, 2, 3, 3, 3, 3, 4,
      4, 4, 4, 5, 5, 5, 5 };
  static const int lengthb_min = minimum(
    (int)(sizeof(lengthbases)/sizeof(lengthbases[0])),
    (int)(sizeof(lengthbits)/sizeof(lengthbits[0]))
  );
  static const unsigned int offsetbases[] =
    {       0,       1,       2,       3,       4,       6,
            8,      12,      16,      24,      32,      48,
           64,      96,     128,     192,     256,     384,
          512,     768,    1024,    1536,    2048,    3072,
         4096,    6144,    8192,   12288,   16384,   24576,
        32768,   49152,   65536,   98304,  131072,  196608,
       262144,  327680,  393216,  458752,  524288,  589824,
       655360,  720896,  786432,  851968,  917504,  983040,
      1048576, 1310720, 1572864, 1835008, 2097152, 2359296,
      2621440, 2883584, 3145728, 3407872, 3670016, 3932160 };
  static const unsigned char offsetbits[] =
    {  0,  0,  0,  0,  1,  1,  2,  2,  3,  3,  4,  4,
       5,  5,  6,  6,  7,  7,  8,  8,  9,  9, 10, 10,
      11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
      16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16,
      18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18 };
  static const int offsetb_min = minimum(
    (int)(sizeof(offsetbases)/sizeof(offsetbases[0])),
    (int)(sizeof(offsetbits)/sizeof(offsetbits[0]))
  );
  static const unsigned char shortbases[] =
    { 0, 4, 8, 16, 32, 64, 128, 192 };
  static const unsigned char shortbits[] =
    { 2, 2, 3, 4, 5, 6, 6, 6 };

  int symbol, offs, len, offsindex, lensymbol, i, offssymbol, lowoffsetsymbol;
  unsigned char newfile;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);

  if (rar->filters.filterstart < *end)
    *end = rar->filters.filterstart;

  while (1)
  {
    if(lzss_position(&rar->lzss) >= *end) {
      return (ARCHIVE_OK);
    }

    if(rar->is_ppmd_block) {
      *end = lzss_position(&rar->lzss);
      return (ARCHIVE_OK);
    }

    if ((symbol = read_next_symbol(a, &rar->maincode)) < 0)
      return (ARCHIVE_FATAL);

    if (symbol < 256)
    {
      lzss_emit_literal(rar, symbol);
      continue;
    }
    else if (symbol == 256)
    {
      if (!rar_br_read_ahead(a, br, 1))
        goto truncated_data;
      newfile = !rar_br_bits(br, 1);
      rar_br_consume(br, 1);

      if(newfile)
      {
        rar->start_new_block = 1;
        if (!rar_br_read_ahead(a, br, 1))
          goto truncated_data;
        rar->start_new_table = rar_br_bits(br, 1);
        rar_br_consume(br, 1);
        *end = lzss_position(&rar->lzss);
        return (ARCHIVE_OK);
      }
      else
      {
        if (parse_codes(a) != ARCHIVE_OK)
          return (ARCHIVE_FATAL);
        continue;
      }
    }
    else if(symbol==257)
    {
      if (!read_filter(a, end))
          return (ARCHIVE_FATAL);
      continue;
    }
    else if(symbol==258)
    {
      if(rar->lastlength == 0)
        continue;

      offs = rar->lastoffset;
      len = rar->lastlength;
    }
    else if (symbol <= 262)
    {
      offsindex = symbol - 259;
      offs = rar->oldoffset[offsindex];

      if ((lensymbol = read_next_symbol(a, &rar->lengthcode)) < 0)
        goto bad_data;
      if (lensymbol > lengthb_min)
        goto bad_data;
      len = lengthbases[lensymbol] + 2;
      if (lengthbits[lensymbol] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[lensymbol]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[lensymbol]);
        rar_br_consume(br, lengthbits[lensymbol]);
      }

      for (i = offsindex; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else if(symbol<=270)
    {
      offs = shortbases[symbol-263] + 1;
      if(shortbits[symbol-263] > 0) {
        if (!rar_br_read_ahead(a, br, shortbits[symbol-263]))
          goto truncated_data;
        offs += rar_br_bits(br, shortbits[symbol-263]);
        rar_br_consume(br, shortbits[symbol-263]);
      }

      len = 2;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else
    {
      if (symbol-271 > lengthb_min)
        goto bad_data;
      len = lengthbases[symbol-271]+3;
      if(lengthbits[symbol-271] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[symbol-271]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[symbol-271]);
        rar_br_consume(br, lengthbits[symbol-271]);
      }

      if ((offssymbol = read_next_symbol(a, &rar->offsetcode)) < 0)
        goto bad_data;
      if (offssymbol > offsetb_min)
        goto bad_data;
      offs = offsetbases[offssymbol]+1;
      if(offsetbits[offssymbol] > 0)
      {
        if(offssymbol > 9)
        {
          if(offsetbits[offssymbol] > 4) {
            if (!rar_br_read_ahead(a, br, offsetbits[offssymbol] - 4))
              goto truncated_data;
            offs += rar_br_bits(br, offsetbits[offssymbol] - 4) << 4;
            rar_br_consume(br, offsetbits[offssymbol] - 4);
          }

          if(rar->numlowoffsetrepeats > 0)
          {
            rar->numlowoffsetrepeats--;
            offs += rar->lastlowoffset;
          }
          else
          {
            if ((lowoffsetsymbol =
              read_next_symbol(a, &rar->lowoffsetcode)) < 0)
              return (ARCHIVE_FATAL);
            if(lowoffsetsymbol == 16)
            {
              rar->numlowoffsetrepeats = 15;
              offs += rar->lastlowoffset;
            }
            else
            {
              offs += lowoffsetsymbol;
              rar->lastlowoffset = lowoffsetsymbol;
            }
          }
        }
        else {
          if (!rar_br_read_ahead(a, br, offsetbits[offssymbol]))
            goto truncated_data;
          offs += rar_br_bits(br, offsetbits[offssymbol]);
          rar_br_consume(br, offsetbits[offssymbol]);
        }
      }

      if (offs >= 0x40000)
        len++;
      if (offs >= 0x2000)
        len++;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }

    rar->lastoffset = offs;
    rar->lastlength = len;

    lzss_emit_match(rar, rar->lastoffset, rar->lastlength);
  }
truncated_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Truncated RAR file data");
  rar->valid = 0;
  return (ARCHIVE_FATAL);
bad_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Bad RAR file data");
  return (ARCHIVE_FATAL);
}